

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O2

void mp::
     WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::array<int,1ul>,std::array<int,0ul>,mp::NotId>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NotId> *cfc,
               ItemNamer *vnam)

{
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  
  value.size_ = 3;
  value.data_ = "Not";
  fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,value);
  fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,'(');
  WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::array<int,1ul>,int>
            (wrt,&cfc->args_,vnam);
  value_00.size_ = 2;
  value_00.data_ = ", ";
  fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,value_00);
  WriteModelItemParameters<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::array<int,0ul>,int>
            (wrt,(array<int,_0UL> *)&cfc->field_0x4);
  fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,')');
  return;
}

Assistant:

inline void WriteModelItem(
    Writer& wrt,
    const CustomConstraintData<A,P,I>& cfc,
    ItemNamer& vnam) {
  wrt << cfc.GetTypeName();
  wrt << '(';
  WriteModelItem(wrt, cfc.GetArguments(), vnam);
  wrt << ", ";
  WriteModelItemParameters(wrt, cfc.GetParameters());
  wrt << ')';
}